

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_processor_xmi.cpp
# Opt level: O2

iff_chunk * __thiscall iff_chunk::find_sub_chunk(iff_chunk *this,char *p_id,uint index)

{
  long lVar1;
  ulong uVar2;
  iff_chunk *piVar3;
  
  piVar3 = (this->m_sub_chunks).super__Vector_base<iff_chunk,_std::allocator<iff_chunk>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar1 = (long)(this->m_sub_chunks).super__Vector_base<iff_chunk,_std::allocator<iff_chunk>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)piVar3;
  uVar2 = 0;
  do {
    if ((ulong)(lVar1 / 0x38) <= uVar2) {
      return this;
    }
    if (*(int *)p_id == *(int *)piVar3->m_id) {
      if (index < 2) {
        return piVar3;
      }
      index = index - 1;
    }
    uVar2 = uVar2 + 1;
    piVar3 = piVar3 + 1;
  } while( true );
}

Assistant:

const iff_chunk & find_sub_chunk( const char * p_id, unsigned index = 0 ) const
    {
        for ( std::size_t i = 0; i < m_sub_chunks.size(); ++i )
        {
            if ( !memcmp( p_id, m_sub_chunks[ i ].m_id, 4 ) )
            {
                if ( index ) --index;
                if ( !index ) return m_sub_chunks[ i ];
            }
        }
        /*throw exception_io_data( pfc::string_formatter() << "Missing IFF chunk: " << p_id );*/
        return *this;
    }